

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool IsWhitespace(ctmbstr pString)

{
  bool bVar1;
  char *local_20;
  ctmbstr cp;
  Bool isWht;
  ctmbstr pString_local;
  
  cp._4_4_ = yes;
  local_20 = pString;
  while( true ) {
    bVar1 = false;
    if ((cp._4_4_ != no) && (bVar1 = false, local_20 != (char *)0x0)) {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) break;
    cp._4_4_ = prvTidyIsWhite((int)*local_20);
    local_20 = local_20 + 1;
  }
  return cp._4_4_;
}

Assistant:

static Bool IsWhitespace( ctmbstr pString )
{
    Bool isWht = yes;
    ctmbstr cp;

    for ( cp = pString; isWht && cp && *cp; ++cp )
    {
        isWht = TY_(IsWhite)( *cp );
    }
    return isWht;
}